

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O0

Aig_Obj_t * Ssw_ObjFrame_(Ssw_Frm_t *p,Aig_Obj_t *pObj,int i)

{
  Aig_Obj_t *pAVar1;
  int i_local;
  Aig_Obj_t *pObj_local;
  Ssw_Frm_t *p_local;
  
  pAVar1 = (Aig_Obj_t *)Vec_PtrGetEntry(p->vAig2Frm,p->nObjs * i + pObj->Id);
  return pAVar1;
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjFrame_( Ssw_Frm_t * p, Aig_Obj_t * pObj, int i )                       { return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     }